

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

Matrix * __thiscall Matrix::print(Matrix *this)

{
  size_t i;
  ulong uVar1;
  size_t j;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 0;
  for (uVar1 = 0; uVar1 < this->rows; uVar1 = uVar1 + 1) {
    for (uVar2 = 0; uVar2 < this->cols; uVar2 = uVar2 + 1) {
      std::ostream::_M_insert<double>
                (*(double *)((long)this->data + uVar2 * 8 + this->cols * lVar3));
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    lVar3 = lVar3 + 8;
  }
  return this;
}

Assistant:

Matrix* Matrix::print() {
	for (size_t i = 0; i < rows; i++) {
		for (size_t j = 0; j < cols; j++) {
			std::cout << data[i * cols + j];
		}
		std::cout << std::endl;
	}
	return this;
}